

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O1

void av1_highbd_dr_prediction_z2_c
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_above,int upsample_left,int dx,int dy,int bd)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  ushort *puVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int shift;
  uint uVar9;
  uint local_64;
  int local_60;
  
  bVar3 = (byte)upsample_above;
  if (0 < bh) {
    local_60 = -dx;
    iVar6 = 0;
    local_64 = 0;
    do {
      if (0 < bw) {
        uVar9 = (~local_64 * dx << (bVar3 & 0x1f)) >> 1 & 0x1f;
        uVar7 = 0;
        iVar4 = -dy;
        iVar8 = local_60;
        do {
          iVar1 = iVar8 >> (6 - bVar3 & 0x1f);
          if (iVar1 < -1 << (bVar3 & 0x1f)) {
            uVar2 = (uint)(iVar4 << ((byte)upsample_left & 0x1f)) >> 1 & 0x1f;
            puVar5 = left + (iVar6 + iVar4 >> (6 - (byte)upsample_left & 0x1f));
            iVar1 = (0x20 - uVar2) * (uint)*puVar5;
          }
          else {
            puVar5 = above + iVar1;
            iVar1 = (uint)*puVar5 * (0x20 - uVar9);
            uVar2 = uVar9;
          }
          dst[uVar7] = (uint16_t)(puVar5[1] * uVar2 + iVar1 + 0x10 >> 5);
          uVar7 = uVar7 + 1;
          iVar8 = iVar8 + 0x40;
          iVar4 = iVar4 - dy;
        } while ((uint)bw != uVar7);
      }
      local_64 = local_64 + 1;
      local_60 = local_60 - dx;
      iVar6 = iVar6 + 0x40;
      dst = dst + stride;
    } while (local_64 != bh);
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z2_c(uint16_t *dst, ptrdiff_t stride, int bw,
                                   int bh, const uint16_t *above,
                                   const uint16_t *left, int upsample_above,
                                   int upsample_left, int dx, int dy, int bd) {
  (void)bd;
  assert(dx > 0);
  assert(dy > 0);

  const int min_base_x = -(1 << upsample_above);
  const int min_base_y = -(1 << upsample_left);
  (void)min_base_y;
  const int frac_bits_x = 6 - upsample_above;
  const int frac_bits_y = 6 - upsample_left;

  for (int r = 0; r < bh; ++r) {
    for (int c = 0; c < bw; ++c) {
      int val;
      int y = r + 1;
      int x = (c << 6) - y * dx;
      const int base_x = x >> frac_bits_x;
      if (base_x >= min_base_x) {
        const int shift = ((x * (1 << upsample_above)) & 0x3F) >> 1;
        val = above[base_x] * (32 - shift) + above[base_x + 1] * shift;
        val = ROUND_POWER_OF_TWO(val, 5);
      } else {
        x = c + 1;
        y = (r << 6) - x * dy;
        const int base_y = y >> frac_bits_y;
        assert(base_y >= min_base_y);
        const int shift = ((y * (1 << upsample_left)) & 0x3F) >> 1;
        val = left[base_y] * (32 - shift) + left[base_y + 1] * shift;
        val = ROUND_POWER_OF_TWO(val, 5);
      }
      dst[c] = val;
    }
    dst += stride;
  }
}